

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cc
# Opt level: O0

Entry * __thiscall mcc::SymbolTable::GetField(SymbolTable *this,Type *type,string *field)

{
  bool bVar1;
  __type _Var2;
  element_type *this_00;
  string *__k;
  mapped_type *pmVar3;
  Entry *local_30;
  Entry *fields;
  string *field_local;
  Type *type_local;
  SymbolTable *this_local;
  
  if ((type->type_ != T_NONE) && (bVar1 = std::operator==(&type->name,(nullptr_t)0x0), !bVar1)) {
    this_00 = std::__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<mcc::Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)type);
    __k = Token::String_abi_cxx11_(this_00);
    pmVar3 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::TypeEntry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mcc::TypeEntry>_>_>
             ::operator[](&this->types_,__k);
    local_30 = pmVar3->next;
    while( true ) {
      if (local_30 == (Entry *)0x0) {
        return (Entry *)0x0;
      }
      _Var2 = std::operator==(&local_30->name,field);
      if (_Var2) break;
      local_30 = local_30->next;
    }
    return local_30;
  }
  return (Entry *)0x0;
}

Assistant:

Entry* SymbolTable::GetField(const Type& type, const std::string& field) {
  if (type.type_ == TokenType::T_NONE || type.name == nullptr) return nullptr;
  Entry* fields = types_[type.name->String()].next;
  while (fields != nullptr) {
    if (fields->name == field) {
      return fields;
    }
    fields = fields->next;
  }

  return nullptr;
}